

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_protocol.h
# Opt level: O3

string * __thiscall
cppcms::http::protocol::unquote<char_const*>
          (string *__return_storage_ptr__,protocol *this,char **begin,char *end)

{
  char **ppcVar1;
  char **ppcVar2;
  
  ppcVar2 = *(char ***)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((ppcVar2 < begin) && (*(char *)ppcVar2 == '\"')) {
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    ppcVar2 = (char **)((long)ppcVar2 + 1);
    while (ppcVar2 < begin) {
      ppcVar1 = (char **)((long)ppcVar2 + 1);
      if (*(char *)ppcVar2 == '\"') {
        *(char ***)this = ppcVar1;
        return __return_storage_ptr__;
      }
      if (ppcVar1 < begin && *(char *)ppcVar2 == '\\') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        ppcVar2 = (char **)((long)ppcVar2 + 2);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        ppcVar2 = ppcVar1;
      }
    }
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string unquote(It &begin,It end)
	{
		It p=begin;
		std::string result;
		if(p>=end || *p!='\"')
			return result;
		result.reserve(end-p);
		p++;
		while(p < end) {
			char c=*p++;
			if(c=='\"') {
				begin=p;
				return result;
			}
			else if(c=='\\' && p<end)
				result+= *p++;
			else
				result+=c;
		}
		result.clear();
		return result;
	}